

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_bool nk_input_is_key_pressed(nk_input *i,nk_keys key)

{
  uint uVar1;
  nk_bool nVar2;
  
  nVar2 = 0;
  if (i != (nk_input *)0x0) {
    uVar1 = (i->keyboard).keys[key].clicked;
    nVar2 = 1;
    if ((i->keyboard).keys[key].down == 0) {
      if (uVar1 < 2) {
        return 0;
      }
    }
    else if (uVar1 == 0) {
      return 0;
    }
  }
  return nVar2;
}

Assistant:

NK_API nk_bool
nk_input_is_key_pressed(const struct nk_input *i, enum nk_keys key)
{
const struct nk_key *k;
if (!i) return nk_false;
k = &i->keyboard.keys[key];
if ((k->down && k->clicked) || (!k->down && k->clicked >= 2))
return nk_true;
return nk_false;
}